

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QRectF>::reserve(QList<QRectF> *this,qsizetype asize)

{
  uint uVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  QRectF *data;
  QRectF *pQVar7;
  long lVar8;
  QRectF *pQVar9;
  QRectF *pQVar10;
  QRectF *pQVar11;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->d).d;
  if ((pDVar2 != (Data *)0x0) &&
     (asize <= (pDVar2->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 5))) {
    uVar1 = (pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar1 & 1) != 0) goto LAB_0060f748;
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar2->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar1 | 1;
      goto LAB_0060f748;
    }
  }
  lVar8 = (this->d).size;
  if (asize < lVar8) {
    asize = lVar8;
  }
  local_20 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar7 = (QRectF *)QArrayData::allocate(&local_20,0x20,0x10,asize,KeepSize);
  lVar8 = (this->d).size;
  if (lVar8 < 1) {
    lVar8 = 0;
  }
  else {
    pQVar10 = (this->d).ptr;
    pQVar9 = pQVar10 + lVar8;
    lVar8 = 0;
    pQVar11 = pQVar7;
    do {
      qVar4 = pQVar10->xp;
      qVar5 = pQVar10->yp;
      qVar6 = pQVar10->h;
      pQVar11->w = pQVar10->w;
      pQVar11->h = qVar6;
      pQVar11->xp = qVar4;
      pQVar11->yp = qVar5;
      pQVar10 = pQVar10 + 1;
      lVar8 = lVar8 + 1;
      pQVar11 = pQVar11 + 1;
    } while (pQVar10 < pQVar9);
  }
  if (local_20 != (QArrayData *)0x0) {
    *(byte *)&(local_20->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(local_20->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  pQVar3 = &((this->d).d)->super_QArrayData;
  (this->d).d = (Data *)local_20;
  (this->d).ptr = pQVar7;
  (this->d).size = lVar8;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,0x20,0x10);
    }
  }
LAB_0060f748:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}